

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall myGame::Game::redraw(Game *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  reference ppOVar4;
  int local_6c;
  int i_2;
  undefined1 local_60 [12];
  int local_54;
  Point t;
  __normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_> local_48;
  iterator i_1;
  Point rb;
  Point zero;
  Point window_coord;
  Point mid;
  int j;
  int i;
  Point s;
  Game *this_local;
  
  s = (Point)this;
  clear();
  move(1);
  Snake::head_coord((Snake *)&j);
  iVar3 = Snake::get_points(&this->snake);
  printw("Your points: %d (%d, %d)",iVar3,j,i);
  for (mid.y = 0; mid.y < this->H; mid.y = mid.y + 1) {
    for (mid.x = 0; mid.x < this->W; mid.x = mid.x + 1) {
      this->map[mid.y][mid.x] = '.';
    }
  }
  Point::Point(&window_coord,this->W / 2,this->H / 2);
  operator-(&zero,(Point *)&j);
  Point::Point(&rb,0,0);
  Point::Point((Point *)&i_1,this->W,this->H);
  local_48._M_current =
       (Object **)std::vector<Object_*,_std::allocator<Object_*>_>::begin(&Object::obj);
  while( true ) {
    t = (Point)std::vector<Object_*,_std::allocator<Object_*>_>::end(&Object::obj);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>
                        *)&t);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>::
    operator*(&local_48);
    Object::get_position((Object *)local_60);
    operator-((Point *)(local_60 + 8),(Point *)local_60);
    bVar1 = operator<(&rb,(Point *)(local_60 + 8));
    if ((bVar1) && (bVar1 = operator<((Point *)(local_60 + 8),(Point *)&i_1), bVar1)) {
      ppOVar4 = __gnu_cxx::
                __normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>::
                operator*(&local_48);
      cVar2 = Object::get_char(*ppOVar4);
      this->map[local_54][(int)local_60._8_4_] = cVar2;
    }
    __gnu_cxx::__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>::
    operator++(&local_48,0);
  }
  for (local_6c = 0; local_6c < this->H; local_6c = local_6c + 1) {
    move(local_6c + 3,3);
    printw("%s",this->map[local_6c]);
  }
  refresh();
  return;
}

Assistant:

void Game::redraw(){
	clear();
	move(1, 1);
	Point s = snake.head_coord();
	printw("Your points: %d (%d, %d)", snake.get_points(), s.x, s.y);
	for (int i = 0; i < H; i++){
		for (int j = 0; j < W; j++){
			map[i][j] = CHR_NOTHING;
		}
	}
	Point mid = Point(W/2, H/2);
	Point window_coord = s - mid;
	Point zero = Point(0, 0);
	Point rb = Point(W, H);
	for (vector<PObject>::iterator i = Object::obj.begin(); i != Object::obj.end(); i++){
		Point t = (*i)->get_position() - window_coord;
		if (zero < t && t < rb){
			map[t.y][t.x] = (*i)->get_char();
		}

	}
	for (int i = 0; i < H; i++){
		move(i + 3, 3);
		printw("%s", map[i]);
	}
	refresh();
}